

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O1

bool __thiscall
pybind11::detail::type_caster_generic::try_implicit_casts
          (type_caster_generic *this,handle src,bool convert)

{
  pointer ppVar1;
  bool bVar2;
  void *pvVar3;
  pointer ppVar4;
  bool bVar5;
  undefined1 local_58 [8];
  type_caster_generic sub_caster;
  
  ppVar4 = (this->typeinfo->implicit_casts).
           super__Vector_base<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->typeinfo->implicit_casts).
           super__Vector_base<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = ppVar4 != ppVar1;
  if (bVar5) {
    sub_caster.value = this;
    type_caster_generic((type_caster_generic *)local_58,ppVar4->first);
    bVar2 = load_impl<pybind11::detail::type_caster_generic>
                      ((type_caster_generic *)local_58,src,convert);
    while (!bVar2) {
      ppVar4 = ppVar4 + 1;
      bVar5 = ppVar4 != ppVar1;
      if (ppVar4 == ppVar1) {
        return bVar5;
      }
      type_caster_generic((type_caster_generic *)local_58,ppVar4->first);
      bVar2 = load_impl<pybind11::detail::type_caster_generic>
                        ((type_caster_generic *)local_58,src,convert);
    }
    pvVar3 = (*ppVar4->second)(sub_caster.cpptype);
    *(void **)((long)sub_caster.value + 0x10) = pvVar3;
  }
  return bVar5;
}

Assistant:

bool try_implicit_casts(handle src, bool convert) {
        for (auto &cast : typeinfo->implicit_casts) {
            type_caster_generic sub_caster(*cast.first);
            if (sub_caster.load(src, convert)) {
                value = cast.second(sub_caster.value);
                return true;
            }
        }
        return false;
    }